

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall cmExportFileGenerator::SetExportFile(cmExportFileGenerator *this,char *mainFile)

{
  string local_78;
  string local_58;
  string local_38;
  char *local_18;
  char *mainFile_local;
  cmExportFileGenerator *this_local;
  
  local_18 = mainFile;
  mainFile_local = (char *)this;
  std::__cxx11::string::operator=((string *)&this->MainImportFile,mainFile);
  cmsys::SystemTools::GetFilenamePath(&local_38,&this->MainImportFile);
  std::__cxx11::string::operator=((string *)&this->FileDir,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_58,&this->MainImportFile);
  std::__cxx11::string::operator=((string *)&this->FileBase,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cmsys::SystemTools::GetFilenameLastExtension(&local_78,&this->MainImportFile);
  std::__cxx11::string::operator=((string *)&this->FileExt,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmExportFileGenerator::SetExportFile(const char* mainFile)
{
  this->MainImportFile = mainFile;
  this->FileDir = cmSystemTools::GetFilenamePath(this->MainImportFile);
  this->FileBase =
    cmSystemTools::GetFilenameWithoutLastExtension(this->MainImportFile);
  this->FileExt =
    cmSystemTools::GetFilenameLastExtension(this->MainImportFile);
}